

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdswitch.c
# Opt level: O1

int text_getc(FILE *file)

{
  int iVar1;
  
  iVar1 = getc((FILE *)file);
  if (iVar1 == 0x23) {
    do {
      iVar1 = getc((FILE *)file);
      if (iVar1 == 10) {
        return 10;
      }
    } while (iVar1 != -1);
  }
  return iVar1;
}

Assistant:

LOCAL(int)
text_getc(FILE *file)
/* Read next char, skipping over any comments (# to end of line) */
/* A comment/newline sequence is returned as a newline */
{
  register int ch;

  ch = getc(file);
  if (ch == '#') {
    do {
      ch = getc(file);
    } while (ch != '\n' && ch != EOF);
  }
  return ch;
}